

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TextOutput.cpp
# Opt level: O2

void __thiscall Test::TextOutput::printFailure(TextOutput *this,Assertion *assertion)

{
  ostream *poVar1;
  allocator<char> local_41;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  poVar1 = std::operator<<(this->stream,"Test \'");
  poVar1 = std::operator<<(poVar1,(string *)&assertion->method);
  poVar1 = std::operator<<(poVar1,'(');
  if ((assertion->args)._M_string_length == 0) {
    std::__cxx11::string::string((string *)&local_40,"",&local_41);
  }
  else {
    std::__cxx11::string::string((string *)&local_40,&assertion->args);
  }
  poVar1 = std::operator<<(poVar1,(string *)&local_40);
  poVar1 = std::operator<<(poVar1,")\' failed!");
  std::endl<char,std::char_traits<char>>(poVar1);
  std::__cxx11::string::~string(&local_40);
  poVar1 = std::operator<<(this->stream,"\tSuite: ");
  poVar1 = std::operator<<(poVar1,(string *)assertion);
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(this->stream,"\tFile: ");
  Private::getFileName(&local_40,&assertion->file);
  poVar1 = std::operator<<(poVar1,(string *)&local_40);
  std::endl<char,std::char_traits<char>>(poVar1);
  std::__cxx11::string::~string(&local_40);
  poVar1 = std::operator<<(this->stream,"\tLine: ");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::endl<char,std::char_traits<char>>(poVar1);
  if ((assertion->errorMessage)._M_string_length != 0) {
    poVar1 = std::operator<<(this->stream,"\tFailure: ");
    poVar1 = std::operator<<(poVar1,(string *)&assertion->errorMessage);
    std::endl<char,std::char_traits<char>>(poVar1);
  }
  if ((assertion->userMessage)._M_string_length != 0) {
    poVar1 = std::operator<<(this->stream,"\tMessage: ");
    poVar1 = std::operator<<(poVar1,(string *)&assertion->userMessage);
    std::endl<char,std::char_traits<char>>(poVar1);
  }
  return;
}

Assistant:

void TextOutput::printFailure(const Assertion &assertion) {
  stream << "Test '" << assertion.method << '(' << (assertion.args.empty() ? "" : assertion.args) << ")' failed!"
         << std::endl;
  stream << "\tSuite: " << assertion.suite << std::endl;
  stream << "\tFile: " << Private::getFileName(assertion.file) << std::endl;
  stream << "\tLine: " << assertion.lineNumber << std::endl;
  if (!assertion.errorMessage.empty())
    stream << "\tFailure: " << assertion.errorMessage << std::endl;
  if (!assertion.userMessage.empty())
    stream << "\tMessage: " << assertion.userMessage << std::endl;
}